

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O3

bool __thiscall
DisasmReplayer::enqueue_create_shader_module
          (DisasmReplayer *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          VkShaderModule *module)

{
  pointer *pppVVar1;
  pointer *pppVVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  bool bVar5;
  mapped_type *pmVar6;
  ulong extraout_RAX;
  VkShaderModuleCreateInfo *local_38;
  Hash local_30;
  
  local_38 = create_info;
  local_30 = hash;
  bVar5 = shader_module_is_active(this,hash);
  if (bVar5) {
    if (this->device == (VulkanDevice *)0x0) {
      *module = (VkShaderModule)hash;
    }
    else {
      enqueue_create_shader_module();
      if ((extraout_RAX & 1) == 0) {
        return false;
      }
    }
    ppVVar3 = (this->shader_modules).
              super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppVVar4 = (this->shader_modules).
              super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pmVar6 = std::__detail::
             _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_int>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->module_to_index,module);
    *pmVar6 = (mapped_type)((ulong)((long)ppVVar3 - (long)ppVVar4) >> 3);
    __position._M_current =
         (this->shader_modules).
         super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->shader_modules).
        super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VkShaderModule_T*,std::allocator<VkShaderModule_T*>>::
      _M_realloc_insert<VkShaderModule_T*const&>
                ((vector<VkShaderModule_T*,std::allocator<VkShaderModule_T*>> *)
                 &this->shader_modules,__position,module);
    }
    else {
      *__position._M_current = *module;
      pppVVar2 = &(this->shader_modules).
                  super__Vector_base<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppVVar2 = *pppVVar2 + 1;
    }
    __position_00._M_current =
         (this->shader_module_infos).
         super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->shader_module_infos).
        super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<VkShaderModuleCreateInfo_const*,std::allocator<VkShaderModuleCreateInfo_const*>>::
      _M_realloc_insert<VkShaderModuleCreateInfo_const*const&>
                ((vector<VkShaderModuleCreateInfo_const*,std::allocator<VkShaderModuleCreateInfo_const*>>
                  *)&this->shader_module_infos,__position_00,&local_38);
    }
    else {
      *__position_00._M_current = create_info;
      pppVVar1 = &(this->shader_module_infos).
                  super__Vector_base<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppVVar1 = *pppVVar1 + 1;
    }
    __position_01._M_current =
         (this->module_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_01._M_current ==
        (this->module_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->module_hashes,
                 __position_01,&local_30);
    }
    else {
      *__position_01._M_current = hash;
      (this->module_hashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position_01._M_current + 1;
    }
  }
  else {
    *module = (VkShaderModule)hash;
  }
  return true;
}

Assistant:

bool enqueue_create_shader_module(Hash hash, const VkShaderModuleCreateInfo *create_info, VkShaderModule *module) override
	{
		if (!shader_module_is_active(hash))
		{
			*module = fake_handle<VkShaderModule>(hash);
			return true;
		}

		if (device)
		{
			LOGI("Creating shader module 0%" PRIX64 "\n", hash);
			if (vkCreateShaderModule(device->get_device(), create_info, nullptr, module) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*module = fake_handle<VkShaderModule>(hash);

		module_to_index[*module] = shader_modules.size();
		shader_modules.push_back(*module);
		shader_module_infos.push_back(create_info);
		module_hashes.push_back(hash);
		return true;
	}